

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_from_entries.cpp
# Opt level: O2

void duckdb::MapFromEntriesFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  idx_t count;
  bool bVar1;
  reference input;
  
  count = args->count;
  input = vector<duckdb::Vector,_true>::get<true>(&args->data,0);
  MapUtil::ReinterpretMap(result,input,count);
  MapVector::MapConversionVerify(result,count);
  Vector::Verify(result,count);
  bVar1 = DataChunk::AllConstant(args);
  if (bVar1) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    return;
  }
  return;
}

Assistant:

static void MapFromEntriesFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	auto count = args.size();

	MapUtil::ReinterpretMap(result, args.data[0], count);
	MapVector::MapConversionVerify(result, count);
	result.Verify(count);

	if (args.AllConstant()) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
	}
}